

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

double __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getDouble
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  bool bVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  double dVar4;
  char *in_RDI;
  double r;
  unsigned_long v;
  undefined8 in_stack_ffffffffffffffe8;
  ExceptionType type;
  Exception *in_stack_fffffffffffffff0;
  
  type = (ExceptionType)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  bVar1 = isDouble((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x127bb8);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception(in_stack_fffffffffffffff0,type,in_RDI);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  puVar3 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x127bff);
  dVar4 = (double)readIntegerFixed<unsigned_long,8ul>(puVar3 + 1);
  return dVar4;
}

Assistant:

double getDouble() const {
    if (!isDouble()) {
      throw Exception(Exception::InvalidValueType, "Expecting type Double");
    }
    auto v = readIntegerFixed<uint64_t, 8>(start() + 1);
    double r;
    std::memcpy(&r, &v, sizeof(double));
    return r;
  }